

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O3

bool tinyusdz::tydra::(anonymous_namespace)::ToProperty<std::__cxx11::string>
               (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *input,Property *output,string *err)

{
  long lVar1;
  undefined8 uVar2;
  byte bVar3;
  undefined1 uVar4;
  undefined1 extraout_AL;
  string *psVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  long lVar7;
  ulong uVar8;
  TimeSamples ts;
  optional<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  aval;
  undefined1 local_948 [17];
  undefined7 uStack_937;
  bool bStack_930;
  TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_928;
  Property *local_920;
  double local_918;
  storage_union local_910;
  undefined1 *local_900;
  storage_union local_8f8;
  undefined8 *local_8e8;
  undefined1 local_8e0;
  undefined1 local_8d8 [24];
  bool local_8c0;
  undefined1 local_8b8 [40];
  _Alloc_hider local_890;
  size_type local_888;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_880;
  storage_union local_870;
  vtable_type *local_860;
  bool local_858;
  undefined1 local_850 [32];
  undefined1 local_830 [24];
  AttrMetas AStack_818;
  undefined1 local_610 [8];
  size_type local_608;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_600;
  char local_5e8;
  char local_5e7;
  undefined1 local_5e0 [24];
  storage_union local_5c8 [89];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  
  local_8b8._0_8_ = local_8b8 + 0x10;
  local_8b8._8_8_ = 0;
  local_8b8[0x10] = '\0';
  local_8b8[0x24] = false;
  local_890._M_p = (pointer)&local_880;
  local_888 = 0;
  local_880._M_local_buf[0] = '\0';
  local_860 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
  local_870.dynamic = (void *)0x0;
  local_858 = false;
  local_850._0_8_ = (pointer)0x0;
  local_850[8] = 0;
  local_850._9_7_ = 0;
  local_850[0x10] = 0;
  local_850._17_8_ = 0;
  AStack_818.interpolation.contained = (storage_t<tinyusdz::Interpolation>)0x0;
  AStack_818.elementSize.has_value_ = false;
  AStack_818.elementSize.contained = (storage_t<unsigned_int>)0x0;
  AStack_818.hidden.has_value_ = false;
  AStack_818.hidden.contained = (storage_t<bool>)0x0;
  AStack_818.comment.has_value_ = false;
  AStack_818.weight.contained = (storage_t<double>)0x0;
  AStack_818.connectability.has_value_ = false;
  AStack_818.bindMaterialAs.contained._16_8_ = 0;
  AStack_818.bindMaterialAs.contained._24_8_ = 0;
  AStack_818.bindMaterialAs.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.bindMaterialAs.contained._8_8_ = 0;
  AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header;
  AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  AStack_818.comment.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.comment.contained._8_8_ = 0;
  AStack_818.comment.contained._16_8_ = 0;
  AStack_818.comment.contained._24_8_ = 0;
  AStack_818.comment.contained._32_8_ = 0;
  AStack_818.comment.contained._40_8_ = 0;
  AStack_818.customData.has_value_ = false;
  AStack_818.customData.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.customData.contained._8_8_ = 0;
  AStack_818.customData.contained._16_8_ = 0;
  AStack_818.customData.contained._24_8_ = 0;
  AStack_818.customData.contained._32_8_ = 0;
  AStack_818.customData.contained._40_8_ = 0;
  AStack_818.weight.has_value_ = false;
  AStack_818.connectability.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.connectability.contained._8_8_ = 0;
  AStack_818.connectability.contained._16_8_ = 0;
  AStack_818.connectability.contained._24_8_ = 0;
  AStack_818.outputName.has_value_ = false;
  AStack_818.outputName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.outputName.contained._8_8_ = 0;
  AStack_818.outputName.contained._16_8_ = 0;
  AStack_818.outputName.contained._24_8_ = 0;
  AStack_818.renderType.has_value_ = false;
  AStack_818.sdrMetadata.has_value_ = false;
  AStack_818.renderType.contained._16_8_ = 0;
  AStack_818.renderType.contained._24_8_ = 0;
  AStack_818.renderType.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.renderType.contained._8_8_ = 0;
  AStack_818.displayName.has_value_ = false;
  AStack_818.sdrMetadata.contained._32_8_ = 0;
  AStack_818.sdrMetadata.contained._40_8_ = 0;
  AStack_818.sdrMetadata.contained._16_8_ = 0;
  AStack_818.sdrMetadata.contained._24_8_ = 0;
  AStack_818.sdrMetadata.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.sdrMetadata.contained._8_8_ = 0;
  AStack_818.displayGroup.has_value_ = false;
  AStack_818.displayName.contained._16_8_ = 0;
  AStack_818.displayName.contained._24_8_ = 0;
  AStack_818.displayName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.displayName.contained._8_8_ = 0;
  AStack_818.bindMaterialAs.has_value_ = false;
  AStack_818.displayGroup.contained._16_8_ = 0;
  AStack_818.displayGroup.contained._24_8_ = 0;
  AStack_818.displayGroup.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.displayGroup.contained._8_8_ = 0;
  local_830[0x10] = 0;
  stack0xfffffffffffff7e1 = 0;
  local_830._0_8_ = (pointer)0x0;
  local_830[8] = 0;
  local_830._9_7_ = 0;
  AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  AStack_818.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  AStack_818.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  AStack_818.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_8b8._32_4_ = Varying;
  local_600._M_allocated_capacity._0_4_ = 0x69727473;
  local_600._M_allocated_capacity._4_2_ = 0x676e;
  local_608 = 6;
  local_600._M_local_buf[6] = '\0';
  local_920 = output;
  AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_610 = (undefined1  [8])&local_600;
  ::std::__cxx11::string::_M_assign((string *)&local_890);
  if (local_610 != (undefined1  [8])&local_600) {
    operator_delete((void *)local_610,
                    CONCAT17(local_600._M_local_buf[7],
                             CONCAT16(local_600._M_local_buf[6],
                                      CONCAT24(local_600._M_allocated_capacity._4_2_,
                                               local_600._M_allocated_capacity._0_4_))) + 1);
  }
  if (input->_blocked == true) {
    local_858 = true;
  }
  if ((input->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (input->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_830,
               (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&input->_paths);
  }
  local_8e8 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
  local_8f8.dynamic = (void *)0x0;
  local_8e0 = 0;
  local_8d8._0_8_ = (pointer)0x0;
  local_8d8[8] = 0;
  local_8d8._9_7_ = 0;
  local_8d8[0x10] = 0;
  stack0xfffffffffffff739 = 0;
  bVar3 = (input->_attrib).has_value_;
  local_610[0] = bVar3;
  if ((bool)bVar3 == true) {
    nonstd::optional_lite::detail::
    storage_t<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::construct_value((storage_t<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_608,(value_type *)&(input->_attrib).contained);
    bVar3 = local_610[0];
  }
  if ((bVar3 & 1) == 0) goto LAB_004ddcc1;
  if (local_5e7 == '\x01') {
    local_858 = true;
    if (local_5e8 != '\0') {
LAB_004ddafd:
      bVar3 = local_610[0];
    }
  }
  else if (local_5e8 != '\0') {
    local_948[8] = 0;
    local_948._9_7_ = 0;
    local_948[0x10] = 0;
    local_948._0_8_ = (pointer)(local_948 + 0x10);
    ::std::__cxx11::string::_M_assign((string *)local_948);
    local_900 = linb::any::vtable_for_type<std::__cxx11::string>()::table;
    psVar5 = (string *)operator_new(0x20);
    *(string **)psVar5 = psVar5 + 0x10;
    ::std::__cxx11::string::_M_construct<char*>
              (psVar5,local_948._0_8_,
               (undefined1 *)
               ((long)(double *)local_948._0_8_ + CONCAT71(local_948._9_7_,local_948[8])));
    local_910.dynamic = psVar5;
    linb::any::operator=((any *)&local_8f8,(any *)&local_910);
    if (local_900 != (undefined1 *)0x0) {
      (**(code **)(local_900 + 0x20))(&local_910);
    }
    if ((pointer)local_948._0_8_ != (pointer)(local_948 + 0x10)) {
      operator_delete((void *)local_948._0_8_,CONCAT71(uStack_937,local_948[0x10]) + 1);
    }
    goto LAB_004ddafd;
  }
  if ((bVar3 & 1) == 0) {
LAB_004dddca:
    __assert_fail("has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                  ,0x591,
                  "value_type &nonstd::optional_lite::optional<tinyusdz::Animatable<std::basic_string<char>>>::value() [T = tinyusdz::Animatable<std::basic_string<char>>]"
                 );
  }
  if ((bool)local_5c8[0]._0_1_ == true) {
    TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::update((TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_5e0);
    bVar3 = local_610[0];
  }
  if (local_5e0._8_8_ != local_5e0._0_8_) {
    if ((bVar3 & 1) == 0) goto LAB_004dddca;
    local_928 = input;
    if ((bool)local_5c8[0]._0_1_ == true) {
      TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::update((TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_5e0);
    }
    local_948[0x10] = 0;
    uStack_937 = 0;
    bStack_930 = false;
    local_948._0_8_ = (pointer)0x0;
    local_948[8] = 0;
    local_948._9_7_ = 0;
    if (local_5e0._8_8_ != local_5e0._0_8_) {
      lVar7 = 0x10;
      uVar8 = 0;
      do {
        uVar2 = local_5e0._0_8_;
        local_918 = *(double *)(local_5e0._0_8_ + lVar7 + -0x10);
        local_900 = linb::any::vtable_for_type<std::__cxx11::string>()::table;
        psVar5 = (string *)operator_new(0x20);
        *(string **)psVar5 = psVar5 + 0x10;
        lVar1 = *(long *)(uVar2 + lVar7 + -8);
        ::std::__cxx11::string::_M_construct<char*>
                  (psVar5,lVar1,*(long *)((long)(double *)uVar2 + lVar7) + lVar1);
        local_910.dynamic = psVar5;
        tinyusdz::value::TimeSamples::add_sample
                  ((TimeSamples *)local_948,local_918,(Value *)&local_910);
        if (local_900 != (undefined1 *)0x0) {
          (**(code **)(local_900 + 0x20))(&local_910);
        }
        uVar8 = uVar8 + 1;
        lVar7 = lVar7 + 0x30;
      } while (uVar8 < (ulong)(((long)(local_5e0._8_8_ - local_5e0._0_8_) >> 4) *
                              -0x5555555555555555));
    }
    ::std::
    vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ::operator=((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 *)local_8d8,
                (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 *)local_948);
    stack0xfffffffffffff739 = CONCAT17(bStack_930,local_8d8._17_7_);
    ::std::
    vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               *)local_948);
    input = local_928;
    bVar3 = local_610[0];
  }
  if ((bVar3 & 1) == 0) goto LAB_004dddca;
  if (local_5e8 == '\0') {
    if ((bool)local_5c8[0]._0_1_ == true) {
      TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::update((TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_5e0);
    }
    if (local_5e0._8_8_ == local_5e0._0_8_) goto LAB_004ddcc1;
  }
  Attribute::set_var((Attribute *)local_8b8,(PrimVar *)&local_8f8);
LAB_004ddcc1:
  if (local_610[0] == '\x01') {
    nonstd::optional_lite::detail::
    storage_t<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::destruct_value((storage_t<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_608);
  }
  ::std::
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             *)local_8d8);
  if (local_8e8 != (undefined8 *)0x0) {
    (*(code *)local_8e8[4])(&local_8f8);
  }
  AttrMetas::operator=(&AStack_818,&input->_metas);
  Property::Property((Property *)local_610,(Attribute *)local_8b8,false);
  Property::operator=(local_920,(Property *)local_610);
  Property::~Property((Property *)local_610);
  AttrMetas::~AttrMetas(&AStack_818);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
            ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_830);
  ::std::
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             *)local_850);
  if (local_860 != (vtable_type *)0x0) {
    (*local_860->destroy)(&local_870);
    local_860 = (vtable_type *)0x0;
  }
  paVar6 = &local_880;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_890._M_p != paVar6) {
    operator_delete(local_890._M_p,
                    CONCAT71(local_880._M_allocated_capacity._1_7_,local_880._M_local_buf[0]) + 1);
    paVar6 = extraout_RAX;
  }
  uVar4 = SUB81(paVar6,0);
  if ((undefined1 *)local_8b8._0_8_ != local_8b8 + 0x10) {
    operator_delete((void *)local_8b8._0_8_,CONCAT71(local_8b8._17_7_,local_8b8[0x10]) + 1);
    uVar4 = extraout_AL;
  }
  return (bool)uVar4;
}

Assistant:

bool ToProperty(const TypedAttribute<Animatable<T>> &input, Property &output, std::string *err) {

  DCOUT("ToProperty ");
  (void)err;

  Attribute attr;

  attr.variability() = Variability::Varying;
  attr.set_type_name(value::TypeTraits<T>::type_name());

  DCOUT("has_connections" << input.has_connections());
  DCOUT("has_value " << input.has_value());
  DCOUT("is_blocked " << input.is_blocked());

  if (input.is_blocked()) {
    attr.set_blocked(input.is_blocked());
  }

  if (input.has_connections()) {
    

    attr.set_connections(input.get_connections());
  }

  //DCOUT("has_default " << input.has_default());
  //DCOUT("has_timesamples " << input.has_timesamples());

  {
    primvar::PrimVar pvar;

    // Includes !authored()
    nonstd::optional<Animatable<T>> aval = input.get_value();
    if (aval) {

      if (aval.value().is_blocked()) {
        attr.set_blocked(true);
      }

      if (aval.value().has_value()) {
        T a;
        if (aval.value().get_default(&a)) {
          value::Value val(a);
          pvar.set_value(val);
        }
      }

      if (aval.value().has_timesamples()) {
        value::TimeSamples ts = ToTypelessTimeSamples(aval.value().get_timesamples());
        pvar.set_timesamples(ts);
      }

      if (aval.value().has_value() || aval.value().has_timesamples()) {
        attr.set_var(std::move(pvar));
      }

    } else {
      DCOUT("no animatable value.");
    }
  }

  attr.metas() = input.metas();

  output = Property(std::move(attr), /*custom*/ false);

  return true;
}